

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::CryptoTest::
TestVector<CHMAC_SHA512,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (CryptoTest *this,CHMAC_SHA512 *h,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  long lVar1;
  uchar *data;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  unsigned_long len;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  check_type cVar10;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  assertion_result local_410;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  CHMAC_SHA512 local_358;
  CHMAC_SHA512 hasher;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_388;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_398,msg);
  local_358.outer.s[1] = 0;
  local_358.outer.s[2] = 0;
  local_410._0_8_ = "out.size() == h.OUTPUT_SIZE";
  local_410.m_message.px = (element_type *)0xb7a611;
  hasher.outer.s[1]._0_1_ = 0;
  hasher.outer.s[0] = (uint64_t)&PTR__lazy_ostream_0113a070;
  hasher.outer.s[2] = (uint64_t)boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_3a0 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  hasher.outer.s[3] = (uint64_t)&local_410;
  local_358.outer.s[0]._0_1_ =
       (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start == 0x40;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_358,(lazy_ostream *)&hasher,1,0,WARN,_cVar10,
             (size_t)&local_3a8,0x25);
  boost::detail::shared_count::~shared_count((shared_count *)(local_358.outer.s + 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&hash,(long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start);
  memcpy(&hasher,h,400);
  data = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  CSHA512::Write(&hasher.inner,data,
                 (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)data);
  CHMAC_SHA512::Finalize
            (&hasher,hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar8;
  file_00.m_end = (iterator)0x2a;
  file_00.m_begin = (iterator)&local_3b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3c8,
             msg_00);
  bVar3 = std::operator==(&hash,out);
  local_358.outer.s[0] = CONCAT71(local_358.outer.s[0]._1_7_,bVar3);
  local_358.outer.s[1] = 0;
  local_358.outer.s[2] = 0;
  local_410._0_8_ = "hash == out";
  local_410.m_message.px = (element_type *)0xc8faf5;
  hasher.outer.s[1]._0_1_ = 0;
  hasher.outer.s[0] = (uint64_t)&PTR__lazy_ostream_0113a070;
  hasher.outer.s[2] = (uint64_t)boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_3d0 = "";
  pvVar8 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  hasher.outer.s[3] = (uint64_t)&local_410;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_358,(lazy_ostream *)&hasher,1,0,WARN,_cVar10,
             (size_t)&local_3d8,0x2a);
  boost::detail::shared_count::~shared_count((shared_count *)(local_358.outer.s + 2));
  for (iVar4 = 0; iVar4 != 0x20; iVar4 = iVar4 + 1) {
    memcpy(&hasher,h,400);
    uVar5 = 0;
    while (uVar6 = (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start, lVar7 = uVar6 - uVar5,
          uVar5 <= uVar6 && lVar7 != 0) {
      len = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&(this->super_BasicTestingSetup).m_rng.super_RandomMixin<FastRandomContext>,
                       (lVar7 + 1U >> 1) + 1);
      CSHA512::Write(&hasher.inner,
                     (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                     .super__Vector_impl_data._M_start + uVar5,len);
      uVar5 = len + uVar5;
      if (uVar5 != 0) {
        puVar2 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
        if ((uVar6 < uVar5 + ((long)(out->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(out->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_start) * 2) &&
           (uVar5 <= uVar6 && uVar6 - uVar5 != 0)) {
          memcpy(&local_358,&hasher,400);
          CSHA512::Write(&local_358.inner,puVar2 + uVar5,uVar6 - uVar5);
          CHMAC_SHA512::Finalize
                    (&local_358,
                     hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
          local_3e8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
          ;
          local_3e0 = "";
          local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
          msg_01.m_end = pvVar9;
          msg_01.m_begin = pvVar8;
          file_01.m_end = (iterator)0x37;
          file_01.m_begin = (iterator)&local_3e8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                     (size_t)&local_3f8,msg_01);
          bVar3 = std::operator==(&hash,out);
          local_410.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(readonly_property<bool>)bVar3;
          local_410.m_message.px = (element_type *)0x0;
          local_410.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_420 = "hash == out";
          local_418 = "";
          local_358.outer.s[1] = local_358.outer.s[1] & 0xffffffffffffff00;
          local_358.outer.s[0] = (uint64_t)&PTR__lazy_ostream_0113a070;
          local_358.outer.s[2] = (uint64_t)boost::unit_test::lazy_ostream::inst;
          local_358.outer.s[3] = (uint64_t)&local_420;
          local_430 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
          ;
          local_428 = "";
          pvVar8 = &DAT_00000001;
          pvVar9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_410,(lazy_ostream *)&local_358,1,0,WARN,_cVar10,(size_t)&local_430,0x37)
          ;
          boost::detail::shared_count::~shared_count(&local_410.m_message.pn);
        }
      }
    }
    CHMAC_SHA512::Finalize
              (&hasher,hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    local_440 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_438 = "";
    local_450 = &boost::unit_test::basic_cstring<char_const>::null;
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = pvVar9;
    msg_02.m_begin = pvVar8;
    file_02.m_end = (iterator)0x3b;
    file_02.m_begin = (iterator)&local_440;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_450,
               msg_02);
    bVar3 = std::operator==(&hash,out);
    local_410.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar3;
    local_410.m_message.px = (element_type *)0x0;
    local_410.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_420 = "hash == out";
    local_418 = "";
    local_358.outer.s[1] = local_358.outer.s[1] & 0xffffffffffffff00;
    local_358.outer.s[0] = (uint64_t)&PTR__lazy_ostream_0113a070;
    local_358.outer.s[2] = (uint64_t)boost::unit_test::lazy_ostream::inst;
    local_358.outer.s[3] = (uint64_t)&local_420;
    local_460 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_458 = "";
    pvVar8 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_410,(lazy_ostream *)&local_358,1,0,WARN,_cVar10,(size_t)&local_460,0x3b);
    boost::detail::shared_count::~shared_count(&local_410.m_message.pn);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestVector(const Hasher &h, const In &in, const Out &out) {
    Out hash;
    BOOST_CHECK(out.size() == h.OUTPUT_SIZE);
    hash.resize(out.size());
    {
        // Test that writing the whole input string at once works.
        Hasher(h).Write((const uint8_t*)in.data(), in.size()).Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
    for (int i=0; i<32; i++) {
        // Test that writing the string broken up in random pieces works.
        Hasher hasher(h);
        size_t pos = 0;
        while (pos < in.size()) {
            size_t len = m_rng.randrange((in.size() - pos + 1) / 2 + 1);
            hasher.Write((const uint8_t*)in.data() + pos, len);
            pos += len;
            if (pos > 0 && pos + 2 * out.size() > in.size() && pos < in.size()) {
                // Test that writing the rest at once to a copy of a hasher works.
                Hasher(hasher).Write((const uint8_t*)in.data() + pos, in.size() - pos).Finalize(hash.data());
                BOOST_CHECK(hash == out);
            }
        }
        hasher.Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
}